

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void open_local_endpoint(connection *conn,int skip_user)

{
  uint *puVar1;
  mg_handler_t p_Var2;
  connection *pcVar3;
  int iVar4;
  uint uVar5;
  char *__s;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  undefined7 uVar11;
  size_t sVar9;
  FILE *pFVar10;
  char *__s_00;
  vec *buf;
  mg_server *pmVar12;
  undefined4 uVar13;
  int iVar14;
  char *pcVar15;
  mg_connection *c;
  unsigned_short port;
  int n;
  file_stat_t st;
  char path [8192];
  char addr [1000];
  ushort local_410a;
  char *local_4108;
  char *local_4100;
  vec local_40f8;
  char *local_40e8;
  mg_connection *local_40e0;
  char *local_40d8;
  char *local_40d0;
  file_stat_t local_40c8;
  char local_4038 [2];
  char acStack_4036 [8190];
  vec local_2038 [512];
  
  conn->endpoint_type = EP_NONE;
  p_Var2 = conn->server->event_handler;
  if (p_Var2 != (mg_handler_t)0x0) {
    iVar4 = (*p_Var2)(&conn->mg_conn,MG_AUTH);
    if (iVar4 == 0) {
      mg_send_digest_auth_request(&conn->mg_conn);
      return;
    }
  }
  if ((skip_user == 0) && (conn->server->event_handler != (mg_handler_t)0x0)) {
    conn->endpoint_type = EP_USER;
    return;
  }
  c = &conn->mg_conn;
  pcVar7 = (conn->mg_conn).request_method;
  iVar4 = strcmp(pcVar7,"CONNECT");
  if (iVar4 == 0) {
LAB_0010bc6c:
    pcVar7 = conn->server->config_options[8];
    if ((pcVar7 == (char *)0x0) || (iVar4 = strcmp(pcVar7,"yes"), iVar4 != 0)) {
      send_http_error(conn,0x195,(char *)0x0);
      return;
    }
    local_410a = 0x50;
    local_40f8.ptr._0_4_ = 0;
    pcVar7 = (conn->mg_conn).uri;
    local_4038[0] = '\0';
    local_40c8.st_dev._0_1_ = 0;
    iVar4 = __isoc99_sscanf(pcVar7,"%499[^: ]:%hu%n");
    if (((iVar4 != 2) &&
        (iVar4 = __isoc99_sscanf(pcVar7,"%9[a-z]://%499[^: ]:%hu%n",&local_40c8,local_4038,
                                 &local_410a,&local_40f8), iVar4 != 3)) &&
       (iVar4 = __isoc99_sscanf(pcVar7,"%9[a-z]://%499[^/ ]%n",&local_40c8,local_4038,&local_40f8),
       iVar4 != 2)) {
      local_40f8.ptr._0_4_ = 0;
    }
    pcVar7 = "ssl";
    if (conn->ns_conn->ssl == (SSL *)0x0) {
      pcVar7 = "tcp";
    }
    snprintf((char *)local_2038,1000,"%s://%s:%hu",pcVar7,local_4038,(ulong)local_410a);
    if ((0 < (int)local_40f8.ptr) && (iVar4 = mg_forward(c,(char *)local_2038), iVar4 != 0)) {
      return;
    }
    puVar1 = &conn->ns_conn->flags;
    *puVar1 = *puVar1 | 0x10;
    return;
  }
  pcVar15 = (conn->mg_conn).uri;
  iVar4 = mg_strncasecmp(pcVar15,"http",4);
  if (iVar4 == 0) goto LAB_0010bc6c;
  iVar4 = strcmp(pcVar7,"OPTIONS");
  if (iVar4 == 0) {
    (conn->mg_conn).status_code = 200;
    mg_printf(c,"%s",
              "HTTP/1.1 200 OK\r\nAllow: GET, POST, HEAD, CONNECT, PUT, DELETE, OPTIONS, PROPFIND, MKCOL\r\nDAV: 1\r\n\r\n"
             );
    close_local_endpoint(conn);
    return;
  }
  pmVar12 = conn->server;
  local_4108 = pmVar12->config_options[0x11];
  pcVar7 = pmVar12->config_options[4];
  __s_00 = pmVar12->config_options[6];
  __s = mg_get_header(c,"Host");
  if (__s_00 == (char *)0x0) {
    pcVar6 = (char *)0x0;
    pcVar8 = __s;
  }
  else {
    pcVar6 = (char *)strlen(__s_00);
    pcVar8 = pcVar6;
  }
  pcVar8 = (char *)CONCAT71((int7)((ulong)pcVar8 >> 8),local_4108 != (char *)0x0);
  local_40d0 = pcVar7;
  if (__s != (char *)0x0 && local_4108 != (char *)0x0) {
    local_40e8 = __s_00;
    local_40d8 = pcVar6;
    pcVar7 = strchr(__s,0x3a);
    local_4100 = __s;
    if (pcVar7 == (char *)0x0) {
      sVar9 = strlen(__s);
      iVar4 = (int)sVar9;
    }
    else {
      iVar4 = (int)pcVar7 - (int)__s;
    }
    pcVar8 = next_option(local_4108,local_2038,&local_40f8);
    __s_00 = local_40e8;
    pcVar6 = local_40d8;
    if (pcVar8 != (char *)0x0) {
      local_4108 = (char *)(long)iVar4;
      pcVar7 = pcVar8;
      local_40e0 = c;
      do {
        if (((1 < local_2038[0].len) && (*local_2038[0].ptr == '@')) &&
           (local_2038[0].len == iVar4 + 1)) {
          uVar5 = mg_strncasecmp(local_2038[0].ptr + 1,local_4100,(size_t)local_4108);
          pcVar8 = (char *)(ulong)uVar5;
          if (uVar5 == 0) {
            __s_00 = (char *)CONCAT44(local_40f8.ptr._4_4_,(int)local_40f8.ptr);
            pcVar6 = (char *)(ulong)(uint)local_40f8.len;
            c = local_40e0;
            goto LAB_0010bf2c;
          }
        }
        pcVar7 = next_option(pcVar7,local_2038,&local_40f8);
      } while (pcVar7 != (char *)0x0);
      pcVar8 = (char *)0x0;
      __s_00 = local_40e8;
      pcVar6 = local_40d8;
      c = local_40e0;
    }
  }
LAB_0010bf2c:
  uVar11 = (undefined7)((ulong)pcVar8 >> 8);
  uVar13 = 0;
  if ((int)pcVar6 == 0 || __s_00 == (char *)0x0) {
    local_4100 = (char *)CONCAT44(local_4100._4_4_,(int)CONCAT71(uVar11,1));
  }
  else {
    local_4100 = (char *)CONCAT44(local_4100._4_4_,(int)CONCAT71(uVar11,1));
    local_40e8 = __s_00;
    mg_snprintf(local_4038,0x2000,"%.*s%s",(ulong)pcVar6 & 0xffffffff,__s_00,pcVar15);
    pcVar7 = conn->server->config_options[0x11];
    do {
      pcVar7 = next_option(pcVar7,local_2038,&local_40f8);
      if (pcVar7 == (char *)0x0) goto LAB_0010bff4;
      uVar5 = mg_match_prefix(local_2038[0].ptr,local_2038[0].len,pcVar15);
    } while ((int)uVar5 < 1);
    mg_snprintf(local_4038,0x2000,"%.*s%s",(ulong)(uint)local_40f8.len,
                CONCAT44(local_40f8.ptr._4_4_,(int)local_40f8.ptr),pcVar15 + uVar5);
LAB_0010bff4:
    iVar4 = stat64(local_4038,(stat64 *)&local_40c8);
    uVar13 = 1;
    if (iVar4 != 0) {
      sVar9 = strlen(local_40e8);
      pcVar7 = local_40d0;
      pcVar15 = acStack_4036 + sVar9;
      do {
        if (*pcVar15 == '/') {
          *pcVar15 = '\0';
          sVar9 = strlen(pcVar7);
          iVar4 = mg_match_prefix(pcVar7,(int)sVar9,local_4038);
          if ((0 < iVar4) && (iVar4 = stat64(local_4038,(stat64 *)&local_40c8), iVar4 == 0)) {
            *pcVar15 = '/';
            pcVar7 = mg_strdup(pcVar15);
            conn->path_info = pcVar7;
            *pcVar15 = '\0';
            local_4100 = (char *)((ulong)local_4100 & 0xffffffff00000000);
            uVar13 = 1;
            goto LAB_0010c0b5;
          }
          *pcVar15 = '/';
        }
        else if (*pcVar15 == '\0') goto LAB_0010c07e;
        pcVar15 = pcVar15 + 1;
      } while( true );
    }
    local_4100 = (char *)((ulong)local_4100 & 0xffffffff00000000);
  }
LAB_0010c0b5:
  pcVar3 = (connection *)c->request_method;
  iVar4 = strcmp((char *)pcVar3,"OPTIONS");
  if (iVar4 == 0) {
    (conn->mg_conn).status_code = 200;
    mg_printf(c,"%s",
              "HTTP/1.1 200 OK\r\nAllow: GET, POST, HEAD, CONNECT, PUT, DELETE, OPTIONS, PROPFIND, MKCOL\r\nDAV: 1\r\n\r\n"
             );
    goto LAB_0010c38d;
  }
  local_4108 = (char *)CONCAT44(local_4108._4_4_,uVar13);
  pmVar12 = conn->server;
  if (pmVar12->config_options[6] == (char *)0x0) goto LAB_0010c199;
  iVar4 = is_dav_request(pcVar3);
  if (iVar4 == 0) {
    buf = (vec *)pmVar12->config_options[10];
    if (buf == (vec *)0x0) {
      if ((char)local_4100 == '\0' && (local_40c8.st_mode & 0xf000) == 0x4000) {
        buf = local_2038;
        mg_snprintf((char *)buf,0x2000,"%s%c%s",local_4038,0x2f,".htpasswd");
      }
      else {
        pcVar7 = strrchr(local_4038,0x2f);
        iVar14 = (int)local_4038;
        iVar4 = (int)pcVar7;
        if (pcVar7 == (char *)0x0) {
          iVar4 = iVar14;
        }
        buf = local_2038;
        mg_snprintf((char *)buf,0x2000,"%.*s%c%s",(ulong)(uint)(iVar4 - iVar14),local_4038,0x2f,
                    ".htpasswd");
      }
    }
    pFVar10 = fopen64((char *)buf,"r");
    if (pFVar10 == (FILE *)0x0) goto LAB_0010c0f9;
    iVar4 = mg_authorize_digest(c,(FILE *)pFVar10);
    fclose(pFVar10);
    if (iVar4 != 0) goto LAB_0010c0f9;
  }
  else {
LAB_0010c0f9:
    pcVar3 = (connection *)(conn->mg_conn).request_method;
    iVar4 = is_dav_request(pcVar3);
    pmVar12 = conn->server;
    if ((iVar4 == 0) ||
       ((pcVar7 = pmVar12->config_options[5], pcVar3 != (connection *)0x0 &&
        (iVar4 = strcmp((char *)pcVar3,"PROPFIND"), iVar4 == 0 && pcVar7 == (char *)0x0)))) {
LAB_0010c180:
      iVar4 = must_hide_file((connection *)pmVar12->config_options[0xb],local_4038);
      if (iVar4 == 0) {
        pcVar7 = c->request_method;
        iVar4 = strcmp(pcVar7,"PROPFIND");
        if (iVar4 == 0) {
          handle_propfind(conn,local_4038,&local_40c8,(int)local_4108);
          return;
        }
        iVar4 = strcmp(pcVar7,"MKCOL");
        if (iVar4 == 0) {
          handle_mkcol(conn,local_4038);
          return;
        }
        iVar4 = strcmp(pcVar7,"DELETE");
        if (iVar4 == 0) {
          handle_delete(conn,local_4038);
          return;
        }
        iVar4 = strcmp(pcVar7,"PUT");
        if (iVar4 != 0) {
          mg_send_file_internal(c,local_4038,&local_40c8,(int)local_4108,(char *)0x0);
          return;
        }
        handle_put(conn,local_4038);
        return;
      }
LAB_0010c199:
      send_http_error(conn,0x194,(char *)0x0);
      return;
    }
    if ((pcVar7 != (char *)0x0) && (pFVar10 = fopen64(pcVar7,"r"), pFVar10 != (FILE *)0x0)) {
      iVar4 = mg_authorize_digest(c,(FILE *)pFVar10);
      fclose(pFVar10);
      if (iVar4 != 0) {
        pmVar12 = conn->server;
        goto LAB_0010c180;
      }
    }
  }
  mg_send_digest_auth_request(c);
LAB_0010c38d:
  close_local_endpoint(conn);
  return;
LAB_0010c07e:
  uVar13 = 0;
  goto LAB_0010c0b5;
}

Assistant:

static void open_local_endpoint(struct connection *conn, int skip_user) {
#ifndef MONGOOSE_NO_FILESYSTEM
  char path[MAX_PATH_SIZE];
  file_stat_t st;
  int exists = 0;
#endif

  // If EP_USER was set in a prev call, reset it
  conn->endpoint_type = EP_NONE;

#ifndef MONGOOSE_NO_AUTH
  if (conn->server->event_handler && call_user(conn, MG_AUTH) == MG_FALSE) {
    mg_send_digest_auth_request(&conn->mg_conn);
    return;
  }
#endif

  // Call URI handler if one is registered for this URI
  if (skip_user == 0 && conn->server->event_handler != NULL) {
    conn->endpoint_type = EP_USER;
#if MONGOOSE_POST_SIZE_LIMIT > 1
    {
      const char *cl = mg_get_header(&conn->mg_conn, "Content-Length");
      if ((strcmp(conn->mg_conn.request_method, "POST") == 0 ||
           strcmp(conn->mg_conn.request_method, "PUT") == 0) &&
          (cl == NULL || to64(cl) > MONGOOSE_POST_SIZE_LIMIT)) {
        send_http_error(conn, 500, "POST size > %lu",
                        (unsigned long) MONGOOSE_POST_SIZE_LIMIT);
      }
    }
#endif
    return;
  }

  if (strcmp(conn->mg_conn.request_method, "CONNECT") == 0 ||
      mg_strncasecmp(conn->mg_conn.uri, "http", 4) == 0) {
    const char *enp = conn->server->config_options[ENABLE_PROXY];
    if (enp == NULL || strcmp(enp, "yes") != 0) {
      send_http_error(conn, 405, NULL);
    } else {
      proxify_connection(conn);
    }
    return;
  }

  if (!strcmp(conn->mg_conn.request_method, "OPTIONS")) {
    send_options(conn);
    return;
  }

#ifdef MONGOOSE_NO_FILESYSTEM
  send_http_error(conn, 404, NULL);
#else
  exists = convert_uri_to_file_name(conn, path, sizeof(path), &st);

  if (!strcmp(conn->mg_conn.request_method, "OPTIONS")) {
    send_options(conn);
  } else if (conn->server->config_options[DOCUMENT_ROOT] == NULL) {
    send_http_error(conn, 404, NULL);
#ifndef MONGOOSE_NO_AUTH
  } else if ((!is_dav_request(conn) && !is_authorized(conn, path,
               exists && S_ISDIR(st.st_mode))) ||
             (is_dav_request(conn) && !is_authorized_for_dav(conn))) {
    mg_send_digest_auth_request(&conn->mg_conn);
    close_local_endpoint(conn);
#endif
#ifndef MONGOOSE_NO_DAV
  } else if (must_hide_file(conn, path)) {
    send_http_error(conn, 404, NULL);
  } else if (!strcmp(conn->mg_conn.request_method, "PROPFIND")) {
    handle_propfind(conn, path, &st, exists);
  } else if (!strcmp(conn->mg_conn.request_method, "MKCOL")) {
    handle_mkcol(conn, path);
  } else if (!strcmp(conn->mg_conn.request_method, "DELETE")) {
    handle_delete(conn, path);
  } else if (!strcmp(conn->mg_conn.request_method, "PUT")) {
    handle_put(conn, path);
#endif
  } else {
    mg_send_file_internal(&conn->mg_conn, path, &st, exists, NULL);
  }
#endif  // MONGOOSE_NO_FILESYSTEM
}